

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockExpectedCall_callWithPointerParameter_TestShell::createTest
          (TEST_MockExpectedCall_callWithPointerParameter_TestShell *this)

{
  TEST_MockExpectedCall_callWithPointerParameter_Test *this_00;
  TEST_MockExpectedCall_callWithPointerParameter_TestShell *this_local;
  
  this_00 = (TEST_MockExpectedCall_callWithPointerParameter_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                         ,0x125);
  TEST_MockExpectedCall_callWithPointerParameter_Test::
  TEST_MockExpectedCall_callWithPointerParameter_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCall, callWithPointerParameter)
{
    const SimpleString paramName = "paramName";
    void* value = (void*) 0x123;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("void*", call->getInputParameterType(paramName).asCharString());
    POINTERS_EQUAL(value, call->getInputParameter(paramName).getPointerValue());
    STRCMP_CONTAINS("funcName -> void* paramName: <0x123>", call->callToString().asCharString());
}